

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionPrivate::startNetworkLayerStateLookup(QHttpNetworkConnectionPrivate *this)

{
  long in_RDI;
  int timeout;
  QHttpNetworkConnectionChannel *in_stack_000000b8;
  
  if (*(int *)(in_RDI + 0xa0) < 2) {
    *(undefined4 *)(in_RDI + 0x7c) = 4;
    *(undefined4 *)(*(long *)(in_RDI + 0xb8) + 0xe8) = 2;
    QHttpNetworkConnectionChannel::ensureConnection(in_stack_000000b8);
  }
  else {
    *(undefined4 *)(in_RDI + 0x7c) = 4;
    *(undefined4 *)(*(long *)(in_RDI + 0xb8) + 0xe8) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0xb8) + 0x1f0) = 1;
    QTimer::start((int)in_RDI + 0xa8);
    if ((*(byte *)(in_RDI + 0x9c) & 1) == 0) {
      QHttpNetworkConnectionChannel::ensureConnection(in_stack_000000b8);
    }
    else {
      QHttpNetworkConnectionChannel::ensureConnection(in_stack_000000b8);
    }
  }
  return;
}

Assistant:

void QHttpNetworkConnectionPrivate::startNetworkLayerStateLookup()
{
    if (activeChannelCount > 1) {
        // At this time all channels should be unconnected.
        Q_ASSERT(!channels[0].isSocketBusy());
        Q_ASSERT(!channels[1].isSocketBusy());

        networkLayerState = IPv4or6;

        channels[0].networkLayerPreference = QAbstractSocket::IPv4Protocol;
        channels[1].networkLayerPreference = QAbstractSocket::IPv6Protocol;

        int timeout = 300;
        delayedConnectionTimer.start(timeout);
        if (delayIpv4)
            channels[1].ensureConnection();
        else
            channels[0].ensureConnection();
    } else {
        networkLayerState = IPv4or6;
        channels[0].networkLayerPreference = QAbstractSocket::AnyIPProtocol;
        channels[0].ensureConnection();
    }
}